

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_impl.h
# Opt level: O0

void __thiscall spdlog::logger::logger(logger *this,string *logger_name,sinks_init_list sinks_list)

{
  const_iterator local_58;
  const_iterator local_50;
  string local_48;
  string *local_28;
  string *logger_name_local;
  logger *this_local;
  sinks_init_list sinks_list_local;
  
  sinks_list_local._M_array = (iterator)sinks_list._M_len;
  this_local = (logger *)sinks_list._M_array;
  local_28 = logger_name;
  logger_name_local = (string *)this;
  std::__cxx11::string::string((string *)&local_48,(string *)logger_name);
  local_50 = std::initializer_list<std::shared_ptr<spdlog::sinks::sink>_>::begin
                       ((initializer_list<std::shared_ptr<spdlog::sinks::sink>_> *)&this_local);
  local_58 = std::initializer_list<std::shared_ptr<spdlog::sinks::sink>_>::end
                       ((initializer_list<std::shared_ptr<spdlog::sinks::sink>_> *)&this_local);
  logger<std::shared_ptr<spdlog::sinks::sink>const*>(this,&local_48,&local_50,&local_58);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

inline spdlog::logger::logger(const std::string &logger_name, sinks_init_list sinks_list)
    : logger(logger_name, sinks_list.begin(), sinks_list.end())
{
}